

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O3

void __thiscall ikfast::IkSolution<double>::Validate(IkSolution<double> *this)

{
  byte bVar1;
  pointer pIVar2;
  uchar *puVar3;
  runtime_error *this_00;
  long lVar4;
  
  pIVar2 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_vbasesol).
                super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    puVar3 = pIVar2->indices + 1;
    do {
      bVar1 = puVar3[-2];
      if (bVar1 != 0) {
        if (bVar1 == 0xff) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"max solutions for joint not initialized");
LAB_00113429:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (bVar1 <= puVar3[-1]) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"index >= max solutions for joint");
          goto LAB_00113429;
        }
        if (bVar1 <= *puVar3 && *puVar3 != 0xff) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"2nd index >= max solutions for joint");
          goto LAB_00113429;
        }
      }
      puVar3 = puVar3 + 0x18;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

virtual void Validate() const {
        for(size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].maxsolutions == (unsigned char)-1) {
                throw std::runtime_error("max solutions for joint not initialized");
            }
            if( _vbasesol[i].maxsolutions > 0 ) {
                if( _vbasesol[i].indices[0] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("index >= max solutions for joint");
                }
                if( _vbasesol[i].indices[1] != (unsigned char)-1 && _vbasesol[i].indices[1] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("2nd index >= max solutions for joint");
                }
            }
        }
    }